

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

int Abc_NtkFraigSweep(Abc_Ntk_t *pNtk,int fUseInv,int fExdc,int fVerbose,int fVeryVerbose)

{
  Abc_NtkType_t AVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  bool bVar3;
  Abc_Obj_t *pAVar4;
  Fraig_Node_t *pFVar5;
  Abc_Obj_t *pAVar6;
  Fraig_Node_t *pFVar7;
  void *pvVar8;
  stmm_table *table;
  Abc_Obj_t *pAVar9;
  stmm_generator *psVar10;
  Abc_Obj_t **ppAVar11;
  char *pcVar12;
  Abc_Obj_t *pAVar13;
  Abc_Obj_t *pAVar14;
  Abc_Obj_t *pAVar15;
  int iVar16;
  Abc_Obj_t *pAVar17;
  int iVar18;
  Abc_Obj_t *pAVar19;
  ulong uVar20;
  stmm_table *table_00;
  float fVar21;
  float fVar22;
  Abc_Obj_t *pList;
  uint local_a0;
  int local_9c;
  stmm_table *local_98;
  Fraig_Man_t *local_90;
  Abc_Ntk_t *local_88;
  Abc_Obj_t **ppSlot;
  Fraig_Node_t *gNode;
  Fraig_Params_t Params;
  
  AVar1 = pNtk->ntkType;
  local_9c = fVeryVerbose;
  if (AVar1 == ABC_NTK_STRASH) {
    __assert_fail("!Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                  ,0x47,"int Abc_NtkFraigSweep(Abc_Ntk_t *, int, int, int, int)");
  }
  bVar3 = pNtk->ntkFunc == ABC_FUNC_MAP;
  if (AVar1 == ABC_NTK_LOGIC && bVar3) {
    for (iVar18 = 0; iVar18 < pNtk->vObjs->nSize; iVar18 = iVar18 + 1) {
      pAVar6 = Abc_NtkObj(pNtk,iVar18);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
        pAVar6->pNext = (Abc_Obj_t *)pAVar6->field_5;
      }
    }
  }
  iVar18 = 0;
  local_88 = Abc_NtkStrash(pNtk,0,1,0);
  if (AVar1 == ABC_NTK_LOGIC && bVar3) {
    Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
    pvVar8 = Abc_FrameReadLibGen();
    pNtk->pManFunc = pvVar8;
    pNtk->ntkFunc = ABC_FUNC_MAP;
    for (; iVar18 < pNtk->vObjs->nSize; iVar18 = iVar18 + 1) {
      pAVar6 = Abc_NtkObj(pNtk,iVar18);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
        pAVar6->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pAVar6->pNext;
        pAVar6->pNext = (Abc_Obj_t *)0x0;
      }
    }
  }
  Fraig_ParamsSetDefault(&Params);
  Params.fInternal = 1;
  iVar18 = 0;
  local_90 = (Fraig_Man_t *)Abc_NtkToFraig(local_88,&Params,0,0);
  if (fExdc != 0) {
    if (pNtk->pExdc == (Abc_Ntk_t *)0x0) {
      puts("Warning: Networks has no EXDC.");
    }
    else {
      pFVar5 = Abc_NtkToFraigExdc(local_90,pNtk,pNtk->pExdc);
      for (iVar16 = 0; iVar16 < pNtk->vObjs->nSize; iVar16 = iVar16 + 1) {
        pAVar6 = Abc_NtkObj(pNtk,iVar16);
        if ((((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) &&
            ((pAVar6->vFanins).nSize != 0)) && (aVar2 = pAVar6->field_6, aVar2.pTemp != (void *)0x0)
           ) {
          uVar20 = (ulong)(aVar2.iTemp & 1);
          pFVar7 = Fraig_NodeAnd(local_90,(Fraig_Node_t *)
                                          (*(ulong *)(((ulong)aVar2.pTemp & 0xfffffffffffffffe) +
                                                     0x40) ^ uVar20),
                                 (Fraig_Node_t *)((ulong)pFVar5 ^ 1));
          *(ulong *)(((ulong)aVar2.pTemp & 0xfffffffffffffffe) + 0x40) = (ulong)pFVar7 ^ uVar20;
        }
      }
    }
  }
  Abc_NtkLevel(pNtk);
  table = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  for (; iVar18 < pNtk->vObjs->nSize; iVar18 = iVar18 + 1) {
    pAVar6 = Abc_NtkObj(pNtk,iVar18);
    if (((pAVar6 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) &&
       (((pAVar6->vFanins).nSize != 0 &&
        ((aVar2 = pAVar6->field_6, aVar2.pTemp != (void *)0x0 &&
         (pAVar9 = Abc_NodeFindCoFanout(pAVar6), pAVar9 == (Abc_Obj_t *)0x0)))))) {
      uVar20 = *(ulong *)(((ulong)aVar2.pTemp & 0xfffffffffffffffe) + 0x40);
      pFVar5 = (Fraig_Node_t *)(aVar2.iTemp & 1 ^ uVar20);
      gNode = pFVar5;
      iVar16 = stmm_find_or_add(table,(char *)(uVar20 & 0xfffffffffffffffe),(char ***)&ppSlot);
      if (iVar16 == 0) {
        *ppSlot = (Abc_Obj_t *)0x0;
      }
      pAVar6->pNext = *ppSlot;
      *ppSlot = pAVar6;
      *(uint *)&pAVar6->field_0x14 =
           *(uint *)&pAVar6->field_0x14 & 0xffffff7f | ((uint)pFVar5 & 1) << 7;
    }
  }
  local_98 = stmm_init_table(stmm_ptrcmp,stmm_ptrhash);
  psVar10 = stmm_init_gen(table);
  local_a0 = 0;
  uVar20 = 0;
  while (iVar18 = stmm_gen(psVar10,(char **)&gNode,(char **)&pList), iVar18 != 0) {
    if ((pList != (Abc_Obj_t *)0x0) && (pList->pNext != (Abc_Obj_t *)0x0)) {
      stmm_insert(local_98,(char *)pList,(char *)0x0);
      for (ppAVar11 = &pList; *ppAVar11 != (Abc_Obj_t *)0x0; ppAVar11 = &(*ppAVar11)->pNext) {
        uVar20 = (ulong)((int)uVar20 + 1);
      }
      if (local_9c != 0) {
        printf("Class %2d : {",(ulong)local_a0);
        ppAVar11 = &pList;
        while (pAVar6 = *ppAVar11, pAVar6 != (Abc_Obj_t *)0x0) {
          (pAVar6->field_6).pTemp = (void *)0x0;
          pcVar12 = Abc_ObjName(pAVar6);
          printf(" %s",pcVar12);
          printf("(%c)",(ulong)((uint)((byte)pAVar6->field_0x14 >> 7) * 2 + 0x2b));
          printf("(%d)",(ulong)(*(uint *)&pAVar6->field_0x14 >> 0xc));
          ppAVar11 = &pAVar6->pNext;
        }
        puts(" }");
        local_a0 = local_a0 + 1;
      }
    }
  }
  stmm_free_gen(psVar10);
  table_00 = local_98;
  if (local_9c != 0 || fVerbose != 0) {
    printf("Sweeping stats for network \"%s\":\n",pNtk->pName);
    printf("Internal nodes = %d. Different functions (up to compl) = %d.\n",
           (ulong)(uint)pNtk->nObjCounts[7],(ulong)(uint)table->num_entries);
    printf("Non-trivial classes = %d. Nodes in non-trivial classes = %d.\n",
           (ulong)(uint)table_00->num_entries,uVar20);
  }
  stmm_free_table(table);
  if (table_00->num_entries != 0) {
    if (pNtk->ntkFunc == ABC_FUNC_MAP) {
      Abc_NtkDelayTrace(pNtk,(Abc_Obj_t *)0x0,(Abc_Obj_t *)0x0,0);
      psVar10 = stmm_init_gen(table_00);
      while (iVar18 = stmm_gen(psVar10,(char **)&pList,(char **)0x0), iVar18 != 0) {
        if (pList == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x13b,
                        "void Abc_NtkFraigMergeClassMapped(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        if (pList->pNext == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain->pNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x13c,
                        "void Abc_NtkFraigMergeClassMapped(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        pAVar6 = (Abc_Obj_t *)0x0;
        pAVar13 = pList;
        pAVar17 = pList->pNext;
        pAVar9 = (Abc_Obj_t *)0x0;
        while (pAVar15 = pAVar17, pAVar17 = pAVar6, pAVar14 = pAVar6, pAVar13 != (Abc_Obj_t *)0x0) {
          pAVar14 = pAVar9;
          pAVar19 = pAVar13;
          if (-1 < (char)pAVar13->field_0x14) {
            pAVar14 = pAVar13;
            pAVar19 = pAVar6;
            pAVar17 = pAVar9;
          }
          pAVar6 = pAVar19;
          pAVar13->pNext = pAVar17;
          pAVar13 = pAVar15;
          pAVar17 = (Abc_Obj_t *)0x0;
          pAVar9 = pAVar14;
          if (pAVar15 != (Abc_Obj_t *)0x0) {
            pAVar17 = pAVar15->pNext;
          }
        }
        for (; pAVar17 != (Abc_Obj_t *)0x0; pAVar17 = pAVar17->pNext) {
          fVar21 = Abc_NodeReadArrivalWorst(pAVar14);
          fVar22 = Abc_NodeReadArrivalWorst(pAVar17);
          pAVar13 = pAVar17;
          if ((fVar21 <= fVar22) &&
             (((fVar21 != fVar22 || (NAN(fVar21) || NAN(fVar22))) ||
              (*(uint *)&pAVar14->field_0x14 >> 0xc <= *(uint *)&pAVar17->field_0x14 >> 0xc)))) {
            pAVar13 = pAVar14;
          }
          pAVar14 = pAVar13;
        }
        for (; pAVar13 = pAVar9, pAVar17 = pAVar9, pAVar6 != (Abc_Obj_t *)0x0;
            pAVar6 = pAVar6->pNext) {
          if (pAVar6 != pAVar14) {
            Abc_ObjTransferFanout(pAVar6,pAVar14);
          }
        }
        for (; pAVar17 != (Abc_Obj_t *)0x0; pAVar17 = pAVar17->pNext) {
          fVar21 = Abc_NodeReadArrivalWorst(pAVar13);
          fVar22 = Abc_NodeReadArrivalWorst(pAVar17);
          pAVar6 = pAVar17;
          if ((fVar21 <= fVar22) &&
             (((fVar21 != fVar22 || (NAN(fVar21) || NAN(fVar22))) ||
              (*(uint *)&pAVar13->field_0x14 >> 0xc <= *(uint *)&pAVar17->field_0x14 >> 0xc)))) {
            pAVar6 = pAVar13;
          }
          pAVar13 = pAVar6;
        }
        for (; pAVar9 != (Abc_Obj_t *)0x0; pAVar9 = pAVar9->pNext) {
          if (pAVar9 != pAVar13) {
            Abc_ObjTransferFanout(pAVar9,pAVar13);
          }
        }
      }
    }
    else {
      psVar10 = stmm_init_gen(table_00);
      while (iVar18 = stmm_gen(psVar10,(char **)&pList,(char **)0x0), iVar18 != 0) {
        if (pList == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x18d,"void Abc_NtkFraigMergeClass(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        pAVar6 = pList->pNext;
        pAVar9 = pAVar6;
        pAVar13 = pList;
        if (pAVar6 == (Abc_Obj_t *)0x0) {
          __assert_fail("pChain->pNext",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSweep.c"
                        ,0x18e,"void Abc_NtkFraigMergeClass(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
        }
        for (; pAVar9 != (Abc_Obj_t *)0x0; pAVar9 = pAVar9->pNext) {
          pAVar17 = pAVar9;
          if (*(uint *)&pAVar13->field_0x14 >> 0xc <= *(uint *)&pAVar9->field_0x14 >> 0xc) {
            pAVar17 = pAVar13;
          }
          pAVar13 = pAVar17;
        }
        pAVar17 = (Abc_Obj_t *)0x0;
        pAVar14 = pList;
        pAVar9 = (Abc_Obj_t *)0x0;
        while (pAVar15 = pAVar6, pAVar14 != (Abc_Obj_t *)0x0) {
          pAVar19 = pAVar9;
          if (pAVar14 != pAVar13) {
            pAVar4 = pAVar14;
            pAVar6 = pAVar17;
            if (-1 < (char)(pAVar14->field_0x14 ^ pAVar13->field_0x14)) {
              pAVar19 = pAVar14;
              pAVar4 = pAVar17;
              pAVar6 = pAVar9;
            }
            pAVar17 = pAVar4;
            pAVar14->pNext = pAVar6;
          }
          pAVar14 = pAVar15;
          pAVar6 = (Abc_Obj_t *)0x0;
          pAVar9 = pAVar19;
          if (pAVar15 != (Abc_Obj_t *)0x0) {
            pAVar6 = pAVar15->pNext;
          }
        }
        for (; pAVar9 != (Abc_Obj_t *)0x0; pAVar9 = pAVar9->pNext) {
          Abc_ObjTransferFanout(pAVar9,pAVar13);
        }
        if (pAVar17 != (Abc_Obj_t *)0x0) {
          pAVar6 = Abc_NtkCreateNodeInv(pNtk,pAVar13);
          for (; pAVar17 != (Abc_Obj_t *)0x0; pAVar17 = pAVar17->pNext) {
            Abc_ObjTransferFanout(pAVar17,pAVar6);
          }
        }
      }
    }
    stmm_free_gen(psVar10);
    table_00 = local_98;
  }
  stmm_free_table(table_00);
  Fraig_ManFree(local_90);
  Abc_NtkDelete(local_88);
  if (pNtk->ntkFunc == ABC_FUNC_MAP) {
    Abc_NtkCleanup(pNtk,fVerbose);
  }
  else {
    Abc_NtkSweep(pNtk,fVerbose);
  }
  iVar18 = Abc_NtkCheck(pNtk);
  if (iVar18 == 0) {
    puts("Abc_NtkFraigSweep: The network check has failed.");
  }
  return (uint)(iVar18 != 0);
}

Assistant:

int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose )
{
    Fraig_Params_t Params;
    Abc_Ntk_t * pNtkAig;
    Fraig_Man_t * pMan;
    stmm_table * tEquiv;
    Abc_Obj_t * pObj;
    int i, fUseTrick;

    assert( !Abc_NtkIsStrash(pNtk) );

    // save gate assignments
    fUseTrick = 0;
    if ( Abc_NtkIsMappedLogic(pNtk) )
    {
        fUseTrick = 1;
        Abc_NtkForEachNode( pNtk, pObj, i )
            pObj->pNext = (Abc_Obj_t *)pObj->pData;
    }
    // derive the AIG
    pNtkAig = Abc_NtkStrash( pNtk, 0, 1, 0 );
    // reconstruct gate assignments
    if ( fUseTrick )
    {
//        extern void * Abc_FrameReadLibGen(); 
        Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc );
        pNtk->pManFunc = Abc_FrameReadLibGen();
        pNtk->ntkFunc = ABC_FUNC_MAP;
        Abc_NtkForEachNode( pNtk, pObj, i )
            pObj->pData = pObj->pNext, pObj->pNext = NULL;
    }

    // perform fraiging of the AIG
    Fraig_ParamsSetDefault( &Params );
    Params.fInternal = 1;
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pNtkAig, &Params, 0, 0 );   
    // cannot use EXDC with FRAIG because it can create classes of equivalent FRAIG nodes
    // with representative nodes that do not correspond to the nodes with the current network

    // update FRAIG using EXDC
    if ( fExdc )
    {
        if ( pNtk->pExdc == NULL )
            printf( "Warning: Networks has no EXDC.\n" );
        else
            Abc_NtkFraigSweepUsingExdc( pMan, pNtk );
    }
    // assign levels to the nodes of the network
    Abc_NtkLevel( pNtk );

    // collect the classes of equivalent nets
    tEquiv = Abc_NtkFraigEquiv( pNtk, fUseInv, fVerbose, fVeryVerbose );

    // transform the network into the equivalent one
    Abc_NtkFraigTransform( pNtk, tEquiv, fUseInv, fVerbose );
    stmm_free_table( tEquiv );

    // free the manager
    Fraig_ManFree( pMan );
    Abc_NtkDelete( pNtkAig );

    // cleanup the dangling nodes
    if ( Abc_NtkHasMapping(pNtk) )
        Abc_NtkCleanup( pNtk, fVerbose );
    else
        Abc_NtkSweep( pNtk, fVerbose );

    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkFraigSweep: The network check has failed.\n" );
        return 0;
    }
    return 1;
}